

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>::reallocateAndGrow
          (QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *old)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Changing *pCVar3;
  Data *pDVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  undefined1 *puVar10;
  long lVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (Changing *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (Changing *)0x0)) {
    puVar10 = (undefined1 *)local_38.size;
    if (this->size != 0) {
      lVar9 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pCVar3 = this->ptr;
      if ((old != (QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x0) || (bVar5)) {
        QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::copyAppend
                  ((QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *)&local_38,pCVar3,
                   pCVar3 + lVar9);
        puVar10 = (undefined1 *)local_38.size;
      }
      else if ((lVar9 != 0) && (0 < lVar9)) {
        lVar11 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pCVar3->parent).r + lVar11);
          uVar6 = *puVar1;
          uVar7 = puVar1[1];
          uVar8 = *(undefined8 *)((long)puVar1 + 0x14);
          puVar2 = (undefined8 *)((long)&local_38.ptr[local_38.size].parent.i + lVar11 + 4);
          *puVar2 = *(undefined8 *)((long)puVar1 + 0xc);
          puVar2[1] = uVar8;
          puVar2 = (undefined8 *)((long)&local_38.ptr[local_38.size].parent.r + lVar11);
          *puVar2 = uVar6;
          puVar2[1] = uVar7;
          uVar6 = puVar1[4];
          uVar7 = puVar1[5];
          uVar8 = puVar1[7];
          puVar2 = (undefined8 *)((long)&local_38.ptr[local_38.size].last.d.data + lVar11 + 0x10);
          *puVar2 = puVar1[6];
          puVar2[1] = uVar8;
          puVar2 = (undefined8 *)((long)&local_38.ptr[local_38.size].last.d.data + lVar11);
          *puVar2 = uVar6;
          puVar2[1] = uVar7;
          puVar1[6] = 0;
          puVar1[4] = 0;
          puVar1[5] = 0;
          puVar1[7] = 2;
          uVar6 = puVar1[8];
          uVar7 = puVar1[9];
          uVar8 = puVar1[0xb];
          puVar2 = (undefined8 *)((long)&local_38.ptr[local_38.size].next.d.data + lVar11 + 0x10);
          *puVar2 = puVar1[10];
          puVar2[1] = uVar8;
          puVar2 = (undefined8 *)((long)&local_38.ptr[local_38.size].next.d.data + lVar11);
          *puVar2 = uVar6;
          puVar2[1] = uVar7;
          puVar1[10] = 0;
          puVar1[8] = 0;
          puVar1[9] = 0;
          puVar1[0xb] = 2;
          puVar10 = puVar10 + 1;
          lVar11 = lVar11 + 0x60;
        } while ((Changing *)(puVar1 + 0xc) < pCVar3 + lVar9);
      }
    }
    local_38.size = (qsizetype)puVar10;
    pDVar4 = this->d;
    pCVar3 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar10 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = pDVar4;
    local_38.ptr = pCVar3;
    local_38.size = (qsizetype)puVar10;
    if (old != (QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar4;
      old->ptr = pCVar3;
      local_38.size = old->size;
      old->size = (qsizetype)puVar10;
    }
    ~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }